

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O0

obj * floorfood(char *verb)

{
  bool bVar1;
  bool bVar2;
  char *pcVar3;
  boolean bVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  trap *trap;
  obj *poVar8;
  bool bVar9;
  char *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  _func_boolean_obj_ptr *local_160;
  _func_boolean_obj_ptr *local_158;
  char local_148 [4];
  int n;
  char qbuf_1 [128];
  object_pick *floorfood_list;
  trap *ttmp;
  _func_boolean_obj_ptr *floorfood_check;
  char local_a8 [2];
  boolean checking_can_floorfood;
  boolean can_floorfood;
  boolean tinning;
  boolean sacrificing;
  boolean feeding;
  char c;
  char qbuf [128];
  obj *local_20;
  obj *otmp;
  char *verb_local;
  
  iVar6 = strcmp(verb,"eat");
  bVar9 = iVar6 == 0;
  iVar6 = strcmp(verb,"sacrifice");
  iVar7 = strcmp(verb,"tin");
  bVar2 = false;
  bVar1 = true;
  if ((verb == (char *)0x0) || (*verb == '\0')) {
    impossible("floorfood: no verb given");
  }
  if (iVar6 != 0) {
    if (iVar7 == 0) {
      local_160 = tinnable;
    }
    else {
      local_160 = other_floorfood;
      if (bVar9) {
        local_160 = is_edible;
      }
    }
    local_158 = local_160;
  }
  else {
    local_158 = can_sacrifice;
  }
  bVar4 = can_reach_floor();
  if ((bVar4 != '\0') && ((!bVar9 || (u.usteed == (monst *)0x0)))) {
    bVar4 = is_pool(level,(int)u.ux,(int)u.uy);
    if ((bVar4 == '\0') && (bVar4 = is_lava(level,(int)u.ux,(int)u.uy), bVar4 == '\0'))
    goto LAB_001c53fd;
    if (((u.uprops[0x27].extrinsic == 0) ||
        (bVar4 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar4 != '\0')) &&
       (((youmonst.data)->mflags1 & 0x10) == 0)) {
      if ((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) {
        if (u.usteed == (monst *)0x0) goto LAB_001c53fd;
        if (((u.usteed)->data->mflags1 & 1) == 0) goto LAB_001c53fd;
      }
      if (u.uprops[0x31].intrinsic != 0) goto LAB_001c53fd;
      if (u.uprops[0x31].extrinsic != 0) goto LAB_001c53fd;
      if (((youmonst.data)->mflags1 & 0x400) != 0) goto LAB_001c53fd;
    }
  }
  do {
    if (!bVar1) {
LAB_001c580f:
      if ((local_20 == (obj *)0x0) || (bVar4 = (*local_158)(local_20), bVar4 != '\0')) {
        verb_local = (char *)local_20;
      }
      else {
        pline("You can\'t %s that!",verb);
        verb_local = (char *)0x0;
      }
      return (obj *)verb_local;
    }
    if (iVar6 != 0) {
      if (bVar9) {
        if (bVar2) {
          local_190 = "\x15\x16\f\x02\x03\b\t\v\x04\x05\a\x06\r\x0e\x0f\x10\n";
        }
        else {
          local_190 = allobj;
        }
        local_198 = local_190;
      }
      else {
        if (bVar2) {
          local_1a0 = "\x15\x16\a";
        }
        else {
          local_1a0 = comestibles;
        }
        local_198 = local_1a0;
      }
      local_188 = local_198;
    }
    else {
      if (bVar2) {
        local_180 = "\x15\x16\x05\a";
      }
      else {
        local_180 = sacrifice_types;
      }
      local_188 = local_180;
    }
    local_20 = getobj(local_188,verb,(obj **)0x0);
    if (local_20 != &zeroobj) goto LAB_001c580f;
    bVar1 = false;
LAB_001c53fd:
    if ((((bVar9) && (((youmonst.data)->mflags1 & 0x80000000) != 0)) &&
        (trap = t_at(level,(int)u.ux,(int)u.uy), trap != (trap *)0x0)) &&
       ((((byte)trap->field_0x8 >> 5 & 1) != 0 && ((trap->field_0x8 & 0x1f) == 5)))) {
      if (bVar1) {
        bVar2 = true;
      }
      else {
        pcVar3 = "Unarmed";
        if (u.utrap != 0 && u.utraptype == 0) {
          pcVar3 = ", holding you";
        }
        sprintf(local_a8,"There is a bear trap here (%s); eat it?",pcVar3 + 2);
        cVar5 = yn_function(local_a8,"ynq",'n');
        if (cVar5 == 'y') {
          u.utraptype = 0;
          u.utrap = 0;
          deltrap(level,trap);
          poVar8 = mksobj(level,0xf9,'\x01','\0');
          return poVar8;
        }
        if (cVar5 == 'q') {
          return (obj *)0x0;
        }
      }
    }
    if (bVar1) {
      for (local_20 = level->objects[u.ux][u.uy]; local_20 != (obj *)0x0;
          local_20 = (local_20->v).v_nexthere) {
        bVar4 = (*local_158)(local_20);
        if (bVar4 != '\0') {
          bVar2 = true;
          break;
        }
      }
    }
    else {
      cVar5 = highc(*verb);
      sprintf(local_148,"%c%s what?",(ulong)(uint)(int)cVar5,verb + 1);
      iVar7 = query_objlist(local_148,level->objects[u.ux][u.uy],9,(object_pick **)(qbuf_1 + 0x78),1
                            ,local_158);
      if (iVar7 == 0) {
        local_20 = (obj *)0x0;
      }
      else {
        local_20 = *(obj **)qbuf_1._120_8_;
        free((void *)qbuf_1._120_8_);
      }
    }
  } while( true );
}

Assistant:

struct obj *floorfood(const char *verb)
{
	struct obj *otmp;
	char qbuf[QBUFSZ];
	char c;
	boolean feeding = (!strcmp(verb, "eat"));
	boolean sacrificing = (!strcmp(verb, "sacrifice"));
	boolean tinning = (!strcmp(verb, "tin"));
	boolean can_floorfood = FALSE;
	boolean checking_can_floorfood = TRUE;
	boolean (*floorfood_check)(const struct obj *);

	if (!verb || !*verb)
	    impossible("floorfood: no verb given");

	floorfood_check = (sacrificing ? can_sacrifice :
			   tinning ? tinnable :
			   feeding ? is_edible : other_floorfood);

	/* if we can't touch floor objects then use invent food only */
	if (!can_reach_floor() ||
		(feeding && u.usteed) || /* can't eat off floor while riding */
		((is_pool(level, u.ux, u.uy) || is_lava(level, u.ux, u.uy)) &&
		    (Wwalking || is_clinger(youmonst.data) ||
			(Flying && !Breathless))))
	    goto skipfloor;

    eat_floorfood:
	/* Two passes:
	 *
	 * 1) Check if anything on the floor can be chosen and make it available
	 *    from the object picking prompt.
	 * 2) If the floor was chosen (,) from that prompt, go through again,
	 *    this time asking for the specific floor option.
	 */

	if (feeding && metallivorous(youmonst.data)) {
	    struct trap *ttmp = t_at(level, u.ux, u.uy);

	    if (ttmp && ttmp->tseen && ttmp->ttyp == BEAR_TRAP) {
		if (checking_can_floorfood) {
		    can_floorfood = TRUE;
		} else {
		    /* If not already stuck in the trap, perhaps there should
		       be a chance to becoming trapped?  Probably not, because
		       then the trap would just get eaten on the _next_ turn... */
		    sprintf(qbuf, "There is a bear trap here (%s); eat it?",
			    (u.utrap && u.utraptype == TT_BEARTRAP) ?
			    "holding you" : "armed");
		    if ((c = yn_function(qbuf, ynqchars, 'n')) == 'y') {
			u.utrap = u.utraptype = 0;
			deltrap(level, ttmp);
			return mksobj(level, BEARTRAP, TRUE, FALSE);
		    } else if (c == 'q') {
			return NULL;
		    }
		}
	    }
	}

	if (checking_can_floorfood) {
	    for (otmp = level->objects[u.ux][u.uy]; otmp; otmp = otmp->nexthere) {
		if ((*floorfood_check)(otmp)) {
		    can_floorfood = TRUE;
		    break;
		}
	    }
	} else {
	    struct object_pick *floorfood_list;
	    char qbuf[QBUFSZ];
	    int n;
	    sprintf(qbuf, "%c%s what?", highc(*verb), verb + 1);
	    n = query_objlist(qbuf, level->objects[u.ux][u.uy],
			      BY_NEXTHERE|INVORDER_SORT, &floorfood_list,
			      PICK_ONE, floorfood_check);
	    if (n) {
		otmp = floorfood_list[0].obj;
		free(floorfood_list);
	    } else {
		otmp = NULL;
	    }
	}

    skipfloor:
	if (checking_can_floorfood) {
	    /* We cannot use ALL_CLASSES since that causes getobj() to skip its
	     * "ugly checks" and we need to check for inedible items.
	     */
	    otmp = getobj(
		    sacrificing ?
			(can_floorfood ? sacrifice_types_ground : sacrifice_types) :
		    feeding ?
			(can_floorfood ? allobj_ground : allobj) :
			(can_floorfood ? comestibles_ground : comestibles),
		    verb, NULL);
	    if (otmp == &zeroobj) {
		checking_can_floorfood = FALSE;
		goto eat_floorfood;
	    }
	}

	if (otmp && !(*floorfood_check)(otmp)) {
	    pline("You can't %s that!", verb);
	    return NULL;
	}
	return otmp;
}